

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::NeuralNetworkPreprocessing
          (NeuralNetworkPreprocessing *this,NeuralNetworkPreprocessing *from)

{
  PreprocessorCase PVar1;
  InternalMetadataWithArenaLite *this_00;
  string *psVar2;
  long lVar3;
  NeuralNetworkImageScaler *this_01;
  NeuralNetworkImageScaler *from_00;
  NeuralNetworkMeanImage *this_02;
  NeuralNetworkMeanImage *from_01;
  NeuralNetworkPreprocessing *from_local;
  NeuralNetworkPreprocessing *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__NeuralNetworkPreprocessing_00d53ea8;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  PreprocessorUnion::PreprocessorUnion((PreprocessorUnion *)&this->preprocessor_);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault(&this->featurename_,psVar2);
  featurename_abi_cxx11_(from);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::AssignWithDefault
              (&this->featurename_,psVar2,(from->featurename_).ptr_);
  }
  clear_has_preprocessor(this);
  PVar1 = preprocessor_case(from);
  if (PVar1 != PREPROCESSOR_NOT_SET) {
    if (PVar1 == kScaler) {
      this_01 = mutable_scaler(this);
      from_00 = scaler(from);
      NeuralNetworkImageScaler::MergeFrom(this_01,from_00);
    }
    else if (PVar1 == kMeanImage) {
      this_02 = mutable_meanimage(this);
      from_01 = meanimage(from);
      NeuralNetworkMeanImage::MergeFrom(this_02,from_01);
    }
  }
  return;
}

Assistant:

NeuralNetworkPreprocessing::NeuralNetworkPreprocessing(const NeuralNetworkPreprocessing& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  featurename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.featurename().size() > 0) {
    featurename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.featurename_);
  }
  clear_has_preprocessor();
  switch (from.preprocessor_case()) {
    case kScaler: {
      mutable_scaler()->::CoreML::Specification::NeuralNetworkImageScaler::MergeFrom(from.scaler());
      break;
    }
    case kMeanImage: {
      mutable_meanimage()->::CoreML::Specification::NeuralNetworkMeanImage::MergeFrom(from.meanimage());
      break;
    }
    case PREPROCESSOR_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.NeuralNetworkPreprocessing)
}